

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::Extend(ON_NurbsCurve *this,ON_Interval *domain)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double in_XMM1_Qa;
  ON_Interval local_40;
  
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar3 == '\0') {
    iVar3 = this->m_is_rat;
    iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    iVar3 = (iVar4 + 1) - (uint)(iVar3 == 0);
    dVar8 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    pdVar5 = ON_Interval::operator[](&local_40,0);
    bVar7 = dVar8 < *pdVar5;
    if (dVar8 < *pdVar5) {
      ClampEnd(this,0);
      iVar4 = this->m_order;
      iVar1 = this->m_cv_stride;
      pdVar5 = this->m_cv;
      pdVar2 = this->m_knot;
      in_XMM1_Qa = ON_Interval::operator[](domain,0);
      ON_EvaluateNurbsDeBoor(iVar3,iVar4,iVar1,pdVar5,pdVar2,1,0.0,in_XMM1_Qa);
      if (1 < this->m_order) {
        lVar6 = 0;
        do {
          dVar8 = ON_Interval::operator[](domain,0);
          this->m_knot[lVar6] = dVar8;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (long)this->m_order + -1);
      }
    }
    dVar8 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_40.m_t[1] = in_XMM1_Qa;
    pdVar5 = ON_Interval::operator[](&local_40,1);
    if (*pdVar5 <= dVar8 && dVar8 != *pdVar5) {
      ClampEnd(this,1);
      iVar4 = this->m_order;
      lVar6 = (long)this->m_cv_count - (long)iVar4;
      iVar1 = this->m_cv_stride;
      pdVar5 = this->m_cv + iVar1 * (int)lVar6;
      if (this->m_cv == (double *)0x0) {
        pdVar5 = (double *)0x0;
      }
      pdVar2 = this->m_knot;
      dVar8 = ON_Interval::operator[](domain,1);
      ON_EvaluateNurbsDeBoor(iVar3,iVar4,iVar1,pdVar5,pdVar2 + lVar6,-1,0.0,dVar8);
      iVar3 = ON_KnotCount(this->m_order,this->m_cv_count);
      bVar7 = true;
      if (this->m_cv_count <= iVar3) {
        lVar6 = (long)iVar3 + 1;
        do {
          dVar8 = ON_Interval::operator[](domain,1);
          this->m_knot[lVar6 + -2] = dVar8;
          lVar6 = lVar6 + -1;
        } while (this->m_cv_count < lVar6);
      }
    }
    if (bVar7 != false) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ON_NurbsCurve::Extend(
  const ON_Interval& domain
  )

{
  if (IsClosed()) return false;
  bool is_rat = IsRational() ? true : false;
  int dim = Dimension();
  int cvdim = dim+is_rat;

  bool changed = false;
  if (domain[0] < Domain()[0]){
    ClampEnd(0);
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(0),m_knot,1,0.0,domain[0]);
    for (int i = 0; i < Order()-1; i++)
			m_knot[i] = domain[0];
    changed = true;
  }
  if (domain[1] > Domain()[1]){
    ClampEnd(1);
    int i = CVCount() - Order();
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(i),m_knot + i,-1,0.0,domain[1]);
    for (i = KnotCount()-1; i >= CVCount()-1; i--)
			m_knot[i] = domain[1];
    changed = true;
  }

  if (changed){
    DestroyCurveTree();
  }
  return changed;
}